

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O1

long Vec3::random(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  double dVar8;
  
  if (random_double()::dist == '\0') {
    random();
  }
  if (random_double()::gen == '\0') {
    random();
  }
  dVar5 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)random_double()::gen);
  dVar3 = DAT_001060c0;
  dVar1 = random_double()::dist;
  if (random_double()::dist == '\0') {
    random();
  }
  if (random_double()::gen == '\0') {
    random();
  }
  dVar6 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)random_double()::gen);
  dVar4 = DAT_001060c0;
  dVar2 = random_double()::dist;
  if (random_double()::dist == '\0') {
    random();
  }
  if (random_double()::gen == '\0') {
    random();
  }
  dVar8 = in_XMM1_Qa - in_XMM0_Qa;
  dVar7 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)random_double()::gen);
  dVar7 = (DAT_001060c0 - random_double()::dist) * dVar7 + random_double()::dist;
  *in_RDI = (dVar5 * (dVar3 - dVar1) + dVar1) * dVar8 + in_XMM0_Qa;
  in_RDI[1] = (dVar6 * (dVar4 - dVar2) + dVar2) * dVar8 + in_XMM0_Qa;
  in_RDI[2] = dVar7 * dVar8 + in_XMM0_Qa;
  return (long)in_RDI;
}

Assistant:

inline static Vec3 random(double min, double max) {
            return Vec3(random_double(min,max),random_double(min,max), random_double(min,max));
        }